

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qintc.cc
# Opt level: O3

void try_convert_real<unsigned_long,int>
               (char *description,bool exp_pass,_func_int_unsigned_long_ptr *fn,unsigned_long *i)

{
  size_t sVar1;
  ostream *this;
  char *pcVar2;
  ulong i_00;
  
  i_00 = *(ulong *)fn;
  if ((i_00 & 0xffffffff80000000) != 0) {
    QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(i_00);
    i_00 = *(ulong *)fn;
  }
  if (description == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x2f6280);
  }
  else {
    sVar1 = strlen(description);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,description,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ",2);
  this = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(this," ",1);
  std::ostream::operator<<((ostream *)this,(int)i_00);
  pcVar2 = " FAILED";
  if (exp_pass) {
    pcVar2 = " PASSED";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar2,7);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  return;
}

Assistant:

static void
try_convert_real(char const* description, bool exp_pass, To (*fn)(From const&), From const& i)
{
    bool passed = false;
    try {
        To result = fn(i);
        passed = true;
        std::cout << description << ": " << i << " " << result;
    } catch (std::range_error& e) {
        std::cout << description << ": " << e.what();
        passed = false;
    }
    std::cout << ((passed == exp_pass) ? " PASSED" : " FAILED") << std::endl;
}